

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780SimulationDataGenerator.cpp
# Opt level: O1

void __thiscall HD44780SimulationDataGenerator::Output(HD44780SimulationDataGenerator *this)

{
  uint uVar1;
  char s1 [256];
  undefined8 local_118;
  undefined4 local_110;
  
  DoTransfer(this,false,false,'\x01');
  uVar1 = (int)this + 0x18;
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  local_118 = 0x6f57206f6c6c6548;
  local_110 = 0x646c72;
  DoTransferString(this,false,(char *)&local_118);
  if (this->mRW != (SimulationChannelDescriptor *)0x0) {
    DoTransfer(this,false,true,'\v');
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  }
  DoTransfer(this,false,false,0x8f);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  this->value = this->value + 1;
  sprintf((char *)&local_118,"%u");
  DoTransferString(this,false,(char *)&local_118);
  if (this->mRW != (SimulationChannelDescriptor *)0x0) {
    DoTransfer(this,false,false,0x80);
    SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
    local_118 = CONCAT26(local_118._6_2_,0x6f00000000);
    local_118 = CONCAT44(local_118._4_4_,0x6c6c6548);
    DoTransferString(this,true,(char *)&local_118);
  }
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void HD44780SimulationDataGenerator::Output()
{
    char s1[ 256 ];

    // display clear
    DoTransfer( false, false, _BV( LCD_CLR ) );
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeClearHome * ( 1 + TIMING_MARGIN ) / _US ) );

    // write data ("Hello World")
    strcpy( s1, LCD_MESSAGE_WRITE );
    DoTransferString( false, s1 );

    // if (rw) read busy flag/address
    if( mRW != NULL )
    {
        DoTransfer( false, true, strlen( LCD_MESSAGE_WRITE ) );
        mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );
    }

    // set ddram addr 15
    DoTransfer( false, false, _BV( LCD_DDRAM ) | 15 );
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );

    // write data (incrementing integer)
    sprintf( s1, "%u", value++ );
    DoTransferString( false, s1 );

    // if (rw) set ddram addr 0, read 5 characters
    if( mRW != NULL )
    {
        DoTransfer( false, false, _BV( LCD_DDRAM ) );
        mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( mSettings->mBusyTimeCmdChar * ( 1 + TIMING_MARGIN ) / _US ) );

        strcpy( s1, LCD_MESSAGE_READ );
        DoTransferString( true, s1 );
    }

    // delay 1ms
    mSimulationChannels.AdvanceAll( TimeToSamplesOrMore( 1 / _MS ) );
}